

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O2

int arkLs_AccessMassMem(void *arkode_mem,char *fname,ARKodeMem *ark_mem,ARKLsMassMem *arkls_mem)

{
  ARKLsMassMem pAVar1;
  int error_code;
  ARKodeMem ark_mem_00;
  char *msgfmt;
  
  if (arkode_mem == (void *)0x0) {
    msgfmt = "Integrator memory is NULL.";
    error_code = -1;
    ark_mem_00 = (ARKodeMem)0x0;
  }
  else {
    *ark_mem = (ARKodeMem)arkode_mem;
    pAVar1 = (ARKLsMassMem)(**(code **)((long)arkode_mem + 0xb0))();
    if (pAVar1 != (ARKLsMassMem)0x0) {
      *arkls_mem = pAVar1;
      return 0;
    }
    ark_mem_00 = *ark_mem;
    msgfmt = "Mass matrix solver memory is NULL.";
    error_code = -6;
  }
  arkProcessError(ark_mem_00,error_code,"ARKLS",fname,msgfmt);
  return error_code;
}

Assistant:

int arkLs_AccessMassMem(void* arkode_mem, const char *fname,
                        ARKodeMem *ark_mem, ARKLsMassMem *arkls_mem)
{
  void* ark_step_massmem;
  if (arkode_mem==NULL) {
    arkProcessError(NULL, ARKLS_MEM_NULL, "ARKLS",
                    fname, MSG_LS_ARKMEM_NULL);
    return(ARKLS_MEM_NULL);
  }
  *ark_mem = (ARKodeMem) arkode_mem;
  ark_step_massmem = (*ark_mem)->step_getmassmem(arkode_mem);
  if (ark_step_massmem==NULL) {
    arkProcessError(*ark_mem, ARKLS_MASSMEM_NULL, "ARKLS",
                    fname, MSG_LS_MASSMEM_NULL);
    return(ARKLS_MASSMEM_NULL);
  }
  *arkls_mem = (ARKLsMassMem) ark_step_massmem;
  return(ARKLS_SUCCESS);
}